

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

UniformCollection *
deqp::gles2::Functional::anon_unknown_1::UniformCollection::basicStruct
          (DataType type0,DataType type1,bool containsArrays,char *nameSuffix)

{
  bool bVar1;
  UniformCollection *pUVar2;
  StructType *pSVar3;
  char *pcVar4;
  VarType local_1b8;
  allocator<char> local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  Uniform local_158;
  VarType local_120;
  VarType local_108;
  VarType local_f0;
  VarType local_d8;
  VarType local_c0;
  VarType local_a8;
  undefined1 local_8a;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  StructType *local_48;
  StructType *structType;
  Precision local_38;
  Precision prec1;
  Precision prec0;
  UniformCollection *local_28;
  UniformCollection *res;
  char *nameSuffix_local;
  DataType local_10;
  DataType DStack_c;
  bool containsArrays_local;
  DataType type1_local;
  DataType type0_local;
  
  res = (UniformCollection *)nameSuffix;
  nameSuffix_local._7_1_ = containsArrays;
  local_10 = type1;
  DStack_c = type0;
  pUVar2 = (UniformCollection *)operator_new(0x30);
  UniformCollection(pUVar2);
  local_28 = pUVar2;
  bVar1 = glu::isDataTypeBoolOrBVec(DStack_c);
  local_38 = bVar1 + 1 + (uint)bVar1;
  bVar1 = glu::isDataTypeBoolOrBVec(local_10);
  structType._4_4_ = bVar1 + 1 + (uint)bVar1;
  pSVar3 = (StructType *)operator_new(0x38);
  local_8a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"structType",&local_89);
  std::operator+(&local_68,&local_88,(char *)res);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  glu::StructType::StructType(pSVar3,pcVar4);
  local_8a = 0;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  local_48 = pSVar3;
  glu::VarType::VarType(&local_a8,DStack_c,local_38);
  glu::StructType::addMember(pSVar3,"m0",&local_a8);
  glu::VarType::~VarType(&local_a8);
  pSVar3 = local_48;
  glu::VarType::VarType(&local_c0,local_10,structType._4_4_);
  glu::StructType::addMember(pSVar3,"m1",&local_c0);
  glu::VarType::~VarType(&local_c0);
  pSVar3 = local_48;
  if ((nameSuffix_local._7_1_ & 1) != 0) {
    glu::VarType::VarType(&local_f0,DStack_c,local_38);
    glu::VarType::VarType(&local_d8,&local_f0,3);
    glu::StructType::addMember(pSVar3,"m2",&local_d8);
    glu::VarType::~VarType(&local_d8);
    glu::VarType::~VarType(&local_f0);
    pSVar3 = local_48;
    glu::VarType::VarType(&local_120,local_10,structType._4_4_);
    glu::VarType::VarType(&local_108,&local_120,3);
    glu::StructType::addMember(pSVar3,"m3",&local_108);
    glu::VarType::~VarType(&local_108);
    glu::VarType::~VarType(&local_120);
  }
  addStructType(local_28,local_48);
  pUVar2 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"u_var",&local_199);
  std::operator+(&local_178,&local_198,(char *)res);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  glu::VarType::VarType(&local_1b8,local_48);
  Uniform::Uniform(&local_158,pcVar4,&local_1b8);
  addUniform(pUVar2,&local_158);
  Uniform::~Uniform(&local_158);
  glu::VarType::~VarType(&local_1b8);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  return local_28;
}

Assistant:

static UniformCollection* basicStruct (const glu::DataType type0, const glu::DataType type1, const bool containsArrays, const char* const nameSuffix = "")
	{
		UniformCollection* const	res		= new UniformCollection;
		const glu::Precision		prec0	= glu::isDataTypeBoolOrBVec(type0) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;
		const glu::Precision		prec1	= glu::isDataTypeBoolOrBVec(type1) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;

		StructType* const structType = new StructType((string("structType") + nameSuffix).c_str());
		structType->addMember("m0", glu::VarType(type0, prec0));
		structType->addMember("m1", glu::VarType(type1, prec1));
		if (containsArrays)
		{
			structType->addMember("m2", glu::VarType(glu::VarType(type0, prec0), 3));
			structType->addMember("m3", glu::VarType(glu::VarType(type1, prec1), 3));
		}

		res->addStructType(structType);
		res->addUniform(Uniform((string("u_var") + nameSuffix).c_str(), glu::VarType(structType)));

		return res;
	}